

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpTransfer.cpp
# Opt level: O2

void __thiscall
CFtpTransfer::CFtpTransfer(CFtpTransfer *this,string *ip,int port,int max_connection)

{
  bool bVar1;
  ostream *poVar2;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)ip);
  CTransfer::CTransfer(&this->super_CTransfer,&local_40,port);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_CTransfer)._vptr_CTransfer = (_func_int **)&PTR_Accept_001285a8;
  CManageClient::CManageClient(&this->m_ClientManager);
  this->m_MaxConnections = max_connection;
  this->m_CurrentConnetions = 0;
  bVar1 = CManageClient::LoadConfig(&this->m_ClientManager);
  if (bVar1) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Can not find the deny_ip config file,program would exit");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

CFtpTransfer::CFtpTransfer(const string ip,const int port,const int max_connection)
        :CTransfer(ip,port),m_CurrentConnetions(0),m_MaxConnections(max_connection){
    if(!m_ClientManager.LoadConfig()){
        cout << "Can not find the deny_ip config file,program would exit" << endl;
        exit(-1);
    }
}